

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O1

void __thiscall
ear::PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_>::run
          (PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_> *this,PolarExtentCoreContext *ctx)

{
  float *pfVar1;
  extent_float_t eVar2;
  simd_register<float,_xsimd::fma3<xsimd::avx2>_> cos_angle;
  size_t sVar3;
  size_t sVar4;
  extent_float_t *peVar5;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> *position;
  ulong uVar13;
  PolarExtentCoreContext *extraout_RDX;
  PolarExtentCoreContext *extraout_RDX_00;
  PolarExtentCoreContext *extraout_RDX_01;
  PolarExtentCoreContext *ctx_00;
  float *pfVar14;
  long lVar15;
  size_t sVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  float fVar23;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> pos;
  
  ctx_00 = (PolarExtentCoreContext *)ctx->num_speakers;
  if (ctx_00 != (PolarExtentCoreContext *)0x0) {
    memset(ctx->results,0,(long)ctx_00 << 2);
    ctx_00 = extraout_RDX;
  }
  if (ctx->num_points != 0) {
    lVar17 = 0;
    uVar18 = 0;
    do {
      if (((ulong)(ctx->xs + uVar18) & 0x1f) != 0) {
LAB_0013ad7e:
        __assert_fail("((reinterpret_cast<uintptr_t>(mem) % A::alignment()) == 0) && \"loaded pointer is not properly aligned\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/xsimd/include/xsimd/types/xsimd_batch.hpp"
                      ,0x268,
                      "static batch<T, A> xsimd::batch<float>::load_aligned(const U *) [T = float, A = xsimd::fma3<avx2>, U = float]"
                     );
      }
      cos_angle.super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data
           = ((simd_register<float,_xsimd::fma3<xsimd::avx2>_> *)(ctx->xs + uVar18))->
             super_simd_register<float,_xsimd::avx2>;
      position = (PositionBatch<xsimd::batch<float,_xsimd::fma3<xsimd::avx2>_>_> *)
                 (ctx->ys + uVar18);
      if (((ulong)position & 0x1f) != 0) goto LAB_0013ad7e;
      auVar24 = *(undefined1 (*) [32])
                 (position->x).super_simd_register<float,_xsimd::fma3<xsimd::avx2>_>.
                 super_simd_register<float,_xsimd::avx2>.super_simd_register<float,_xsimd::avx>.data
      ;
      if (((ulong)(ctx->zs + uVar18) & 0x1f) != 0) goto LAB_0013ad7e;
      auVar19 = *(undefined1 (*) [32])(ctx->zs + uVar18);
      if (ctx->is_circular == true) {
        eVar2 = ctx->flippedBasis[3];
        auVar25._4_4_ = eVar2;
        auVar25._0_4_ = eVar2;
        auVar25._8_4_ = eVar2;
        auVar25._12_4_ = eVar2;
        auVar25._16_4_ = eVar2;
        auVar25._20_4_ = eVar2;
        auVar25._24_4_ = eVar2;
        auVar25._28_4_ = eVar2;
        eVar2 = ctx->flippedBasis[4];
        auVar26._4_4_ = eVar2;
        auVar26._0_4_ = eVar2;
        auVar26._8_4_ = eVar2;
        auVar26._12_4_ = eVar2;
        auVar26._16_4_ = eVar2;
        auVar26._20_4_ = eVar2;
        auVar26._24_4_ = eVar2;
        auVar26._28_4_ = eVar2;
        fVar23 = ctx->flippedBasis[5];
        auVar6._4_4_ = auVar19._4_4_ * fVar23;
        auVar6._0_4_ = auVar19._0_4_ * fVar23;
        auVar6._8_4_ = auVar19._8_4_ * fVar23;
        auVar6._12_4_ = auVar19._12_4_ * fVar23;
        auVar6._16_4_ = auVar19._16_4_ * fVar23;
        auVar6._20_4_ = auVar19._20_4_ * fVar23;
        auVar6._24_4_ = auVar19._24_4_ * fVar23;
        auVar6._28_4_ = auVar19._28_4_;
        auVar20 = vfmadd231ps_fma(auVar6,auVar24,auVar26);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),
                                  (undefined1  [32])
                                  cos_angle.super_simd_register<float,_xsimd::avx2>.
                                  super_simd_register<float,_xsimd::avx>.data,auVar25);
        auVar19 = ZEXT1632(auVar20);
        weight_from_cos((batch *)this,(PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_> *)ctx,ctx_00,
                        (batch)cos_angle.super_simd_register<float,_xsimd::avx2>.
                               super_simd_register<float,_xsimd::avx>.data);
        ctx_00 = extraout_RDX_00;
      }
      else {
        weight_stadium((batch *)this,(PolarExtentCoreSimd<xsimd::fma3<xsimd::avx2>_> *)ctx,
                       (PolarExtentCoreContext *)&stack0xffffffffffffff40,position);
        ctx_00 = extraout_RDX_01;
      }
      auVar21._8_4_ = 0x3f800000;
      auVar21._0_8_ = 0x3f8000003f800000;
      auVar21._12_4_ = 0x3f800000;
      auVar21._16_4_ = 0x3f800000;
      auVar21._20_4_ = 0x3f800000;
      auVar21._24_4_ = 0x3f800000;
      auVar21._28_4_ = 0x3f800000;
      auVar6 = vcmpps_avx(auVar19,auVar21,0);
      auVar25 = vpcmpeqd_avx2(auVar24,auVar24);
      auVar24 = auVar25 & ~auVar6;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar24 >> 0x7f,0) == '\0') &&
            (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar24 >> 0xbf,0) == '\0') &&
          (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar24[0x1f])
      {
        ctx_00 = (PolarExtentCoreContext *)ctx->num_speakers;
        if (ctx_00 != (PolarExtentCoreContext *)0x0) {
          uVar13 = 0;
          do {
            pfVar1 = ctx->summed_panning_results + uVar13 + (long)ctx_00 * (uVar18 >> 3);
            if ((((ulong)pfVar1 & 0x1f) != 0) ||
               (pfVar14 = ctx->results + uVar13, ((ulong)pfVar14 & 0x1f) != 0)) goto LAB_0013ad7e;
            fVar23 = pfVar1[1];
            fVar7 = pfVar1[2];
            fVar8 = pfVar1[3];
            fVar9 = pfVar1[4];
            fVar10 = pfVar1[5];
            fVar11 = pfVar1[6];
            fVar12 = pfVar1[7];
            *pfVar14 = *pfVar1 + *pfVar14;
            pfVar14[1] = fVar23 + pfVar14[1];
            pfVar14[2] = fVar7 + pfVar14[2];
            pfVar14[3] = fVar8 + pfVar14[3];
            pfVar14[4] = fVar9 + pfVar14[4];
            pfVar14[5] = fVar10 + pfVar14[5];
            pfVar14[6] = fVar11 + pfVar14[6];
            pfVar14[7] = fVar12 + pfVar14[7];
            uVar13 = uVar13 + 8;
            ctx_00 = (PolarExtentCoreContext *)ctx->num_speakers;
          } while (uVar13 < ctx_00);
        }
      }
      else {
        auVar24 = vcmpps_avx(auVar19,_DAT_0017dfa0,0);
        auVar22 = ZEXT3264(auVar24);
        auVar25 = auVar25 & ~auVar24;
        if (((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(auVar25 >> 0x7f,0) != '\0') ||
               (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(auVar25 >> 0xbf,0) != '\0') ||
             (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             auVar25[0x1f] < '\0') && (sVar3 = ctx->real_num_speakers, sVar3 != 0)) {
          sVar4 = ctx->num_points;
          ctx_00 = (PolarExtentCoreContext *)ctx->panning_results;
          peVar5 = ctx->results;
          sVar16 = 0;
          lVar15 = lVar17;
          do {
            if (((int)ctx_00 + (int)lVar15 & 0x1fU) != 0) goto LAB_0013ad7e;
            pfVar1 = (float *)((long)ctx_00->flippedBasis + lVar15 + -0x44);
            fVar23 = auVar19._4_4_ * pfVar1[1];
            auVar20._0_4_ = auVar19._0_4_ * *pfVar1 + auVar19._16_4_ * pfVar1[4];
            auVar20._4_4_ = fVar23 + fVar23;
            auVar20._8_4_ = auVar19._8_4_ * pfVar1[2] + auVar19._24_4_ * pfVar1[6];
            auVar20._12_4_ = auVar19._12_4_ * pfVar1[3] + auVar22._28_4_;
            auVar20 = vhaddps_avx(auVar20,auVar20);
            auVar20 = vhaddps_avx(auVar20,auVar20);
            fVar23 = auVar20._0_4_ + peVar5[sVar16];
            auVar22 = ZEXT464((uint)fVar23);
            peVar5[sVar16] = fVar23;
            sVar16 = sVar16 + 1;
            lVar15 = lVar15 + sVar4 * 4;
          } while (sVar3 != sVar16);
        }
      }
      uVar18 = uVar18 + 8;
      lVar17 = lVar17 + 0x20;
    } while (uVar18 < ctx->num_points);
  }
  return;
}

Assistant:

void run(PolarExtentCoreContext &ctx) const override {
      for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
           speaker_idx++)
        ctx.results[speaker_idx] = 0.0;

      for (size_t i = 0; i < ctx.num_points; i += batch::size) {
        PositionBatch<batch> pos;
        pos.x = batch::load_aligned(ctx.xs + i);
        pos.y = batch::load_aligned(ctx.ys + i);
        pos.z = batch::load_aligned(ctx.zs + i);

        batch weight = ctx.is_circular ? weight_circle(ctx, pos)
                                       : weight_stadium(ctx, pos);

        bool all_zeros = xsimd::all(weight == 0.0);
        bool all_ones = xsimd::all(weight == 1.0);
        if (all_ones) {
          // add pre-computed sum for this batch
          size_t batch_i = i / batch::size;
          for (size_t speaker_idx = 0; speaker_idx < ctx.num_speakers;
               speaker_idx += batch::size) {
            batch gain =
                batch::load_aligned(ctx.summed_panning_results +
                                    (batch_i * ctx.num_speakers) + speaker_idx);

            extent_float_t *result_ptr = ctx.results + speaker_idx;
            xsimd::store_aligned(result_ptr,
                                 batch::load_aligned(result_ptr) + gain);
          }
        } else if (!all_zeros) {
          for (size_t speaker_idx = 0; speaker_idx < ctx.real_num_speakers;
               speaker_idx++) {
            batch gain = batch::load_aligned(ctx.panning_results +
                                             speaker_idx * ctx.num_points + i);
            ctx.results[speaker_idx] += xsimd::reduce_add(gain * weight);
          }
        }
      }
    }